

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::AttributeGroup::init
          (AttributeGroup *this,EVP_PKEY_CTX *ctx)

{
  int *piVar1;
  InputType IVar2;
  OutputType OVar3;
  TestContext *pTVar4;
  pointer this_00;
  int extraout_EAX;
  DrawTest *pDVar5;
  RenderContext *pRVar6;
  reference pvVar7;
  char *description;
  OutputType type;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  undefined8 extraout_RDX_00;
  string local_2a0;
  string local_280;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_200 [8];
  string desc;
  InputType local_1d8;
  int ioNdx;
  IOPair iopairs [4];
  undefined1 local_198 [8];
  DrawTestSpec spec_3;
  DrawTest *test_3;
  undefined1 local_138 [8];
  DrawTestSpec spec_2;
  DrawTest *test_2;
  undefined1 local_d8 [8];
  DrawTestSpec spec_1;
  DrawTest *test_1;
  undefined1 local_78 [8];
  DrawTestSpec spec;
  DrawTest *test;
  AttributeGroup *this_local;
  
  pDVar5 = (DrawTest *)operator_new(0x138);
  pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  deqp::gls::DrawTest::DrawTest(pDVar5,pTVar4,pRVar6,"single_attribute","Single attribute array.");
  deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_78);
  local_78._0_4_ = glu::ApiType::es(3,1);
  local_78._4_4_ = this->m_primitive;
  spec.apiType.m_bits = 5;
  spec.primitive = this->m_method;
  spec.primitiveCount = this->m_indexType;
  spec.drawMethod = DRAWMETHOD_DRAWARRAYS;
  spec.indexType = this->m_indexStorage;
  spec.indexPointerOffset = 0;
  spec.indexStorage = STORAGE_USER;
  spec.first = 0;
  spec.indexMin = 1;
  spec.indexMax = 0;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
            *)&spec.baseVertex,1);
  piVar1 = &spec.baseVertex;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->inputType = INPUTTYPE_FLOAT;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->outputType = OUTPUTTYPE_VEC2;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->storage = STORAGE_BUFFER;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->usage = USAGE_STATIC_DRAW;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->componentCount = 2;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->offset = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->stride = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->normalize = false;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->instanceDivisor = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->useDefaultAttribute = false;
  addTestIterations(pDVar5,(DrawTestSpec *)local_78,TYPE_DRAW_COUNT);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar5);
  deqp::gls::DrawTestSpec::~DrawTestSpec((DrawTestSpec *)local_78);
  pDVar5 = (DrawTest *)operator_new(0x138);
  pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  deqp::gls::DrawTest::DrawTest
            (pDVar5,pTVar4,pRVar6,"multiple_attributes","Multiple attribute arrays.");
  spec_1.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pDVar5;
  deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_d8);
  local_d8._0_4_ = glu::ApiType::es(3,1);
  local_d8._4_4_ = this->m_primitive;
  spec_1.apiType.m_bits = 5;
  spec_1.primitive = this->m_method;
  spec_1.primitiveCount = this->m_indexType;
  spec_1.drawMethod = DRAWMETHOD_DRAWARRAYS;
  spec_1.indexType = this->m_indexStorage;
  spec_1.indexPointerOffset = 0;
  spec_1.indexStorage = STORAGE_USER;
  spec_1.first = 0;
  spec_1.indexMin = 1;
  spec_1.indexMax = 0;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
            *)&spec_1.baseVertex,2);
  piVar1 = &spec_1.baseVertex;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->inputType = INPUTTYPE_FLOAT;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->outputType = OUTPUTTYPE_VEC2;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->storage = STORAGE_BUFFER;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->usage = USAGE_STATIC_DRAW;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->componentCount = 4;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->offset = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->stride = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->normalize = false;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->instanceDivisor = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->useDefaultAttribute = false;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->inputType = INPUTTYPE_FLOAT;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->outputType = OUTPUTTYPE_VEC2;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->storage = STORAGE_BUFFER;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->usage = USAGE_STATIC_DRAW;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->componentCount = 2;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->offset = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->stride = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->normalize = false;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->instanceDivisor = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->useDefaultAttribute = false;
  addTestIterations((DrawTest *)
                    spec_1.attribs.
                    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(DrawTestSpec *)local_d8,
                    TYPE_DRAW_COUNT);
  tcu::TestNode::addChild
            ((TestNode *)this,
             (TestNode *)
             spec_1.attribs.
             super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  deqp::gls::DrawTestSpec::~DrawTestSpec((DrawTestSpec *)local_d8);
  pDVar5 = (DrawTest *)operator_new(0x138);
  pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  deqp::gls::DrawTest::DrawTest
            (pDVar5,pTVar4,pRVar6,"instanced_attributes","Instanced attribute array.");
  spec_2.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pDVar5;
  deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_138);
  local_138._0_4_ = glu::ApiType::es(3,1);
  local_138._4_4_ = this->m_primitive;
  spec_2.apiType.m_bits = 5;
  spec_2.primitive = this->m_method;
  spec_2.primitiveCount = this->m_indexType;
  spec_2.drawMethod = DRAWMETHOD_DRAWARRAYS;
  spec_2.indexType = this->m_indexStorage;
  spec_2.indexPointerOffset = 0;
  spec_2.indexStorage = STORAGE_USER;
  spec_2.first = 0;
  spec_2.indexMin = 1;
  spec_2.indexMax = 0;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
            *)&spec_2.baseVertex,3);
  piVar1 = &spec_2.baseVertex;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->inputType = INPUTTYPE_FLOAT;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->outputType = OUTPUTTYPE_VEC2;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->storage = STORAGE_BUFFER;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->usage = USAGE_STATIC_DRAW;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->componentCount = 4;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->offset = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->stride = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->normalize = false;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->instanceDivisor = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->useDefaultAttribute = false;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->inputType = INPUTTYPE_FLOAT;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->outputType = OUTPUTTYPE_VEC2;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->storage = STORAGE_BUFFER;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->usage = USAGE_STATIC_DRAW;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->componentCount = 2;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->offset = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->stride = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->normalize = false;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->instanceDivisor = 1;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->useDefaultAttribute = false;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->additionalPositionAttribute = true;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,2);
  pvVar7->inputType = INPUTTYPE_FLOAT;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,2);
  pvVar7->outputType = OUTPUTTYPE_VEC2;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,2);
  pvVar7->storage = STORAGE_BUFFER;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,2);
  pvVar7->usage = USAGE_STATIC_DRAW;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,2);
  pvVar7->componentCount = 3;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,2);
  pvVar7->offset = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,2);
  pvVar7->stride = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,2);
  pvVar7->normalize = false;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,2);
  pvVar7->instanceDivisor = 1;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,2);
  pvVar7->useDefaultAttribute = false;
  addTestIterations((DrawTest *)
                    spec_2.attribs.
                    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(DrawTestSpec *)local_138,
                    TYPE_INSTANCE_COUNT);
  tcu::TestNode::addChild
            ((TestNode *)this,
             (TestNode *)
             spec_2.attribs.
             super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  deqp::gls::DrawTestSpec::~DrawTestSpec((DrawTestSpec *)local_138);
  pDVar5 = (DrawTest *)operator_new(0x138);
  pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  deqp::gls::DrawTest::DrawTest
            (pDVar5,pTVar4,pRVar6,"default_attribute","Attribute specified with glVertexAttrib*.");
  spec_3.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pDVar5;
  deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_198);
  local_198._0_4_ = glu::ApiType::es(3,1);
  local_198._4_4_ = this->m_primitive;
  spec_3.apiType.m_bits = 5;
  spec_3.primitive = this->m_method;
  spec_3.primitiveCount = this->m_indexType;
  spec_3.drawMethod = DRAWMETHOD_DRAWARRAYS;
  spec_3.indexType = this->m_indexStorage;
  spec_3.indexPointerOffset = 0;
  spec_3.indexStorage = STORAGE_USER;
  spec_3.first = 0;
  spec_3.indexMin = 1;
  spec_3.indexMax = 0;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
            *)&spec_3.baseVertex,2);
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_3.baseVertex,0);
  pvVar7->inputType = INPUTTYPE_FLOAT;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_3.baseVertex,0);
  pvVar7->outputType = OUTPUTTYPE_VEC2;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_3.baseVertex,0);
  pvVar7->storage = STORAGE_BUFFER;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_3.baseVertex,0);
  pvVar7->usage = USAGE_STATIC_DRAW;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_3.baseVertex,0);
  pvVar7->componentCount = 2;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_3.baseVertex,0);
  pvVar7->offset = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_3.baseVertex,0);
  pvVar7->stride = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_3.baseVertex,0);
  pvVar7->normalize = false;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_3.baseVertex,0);
  pvVar7->instanceDivisor = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_3.baseVertex,0);
  pvVar7->useDefaultAttribute = false;
  memcpy(&local_1d8,&DAT_02c36850,0x30);
  uVar8 = extraout_RDX;
  for (desc.field_2._12_4_ = 0; (int)desc.field_2._12_4_ < 4;
      desc.field_2._12_4_ = desc.field_2._12_4_ + 1) {
    deqp::gls::DrawTestSpec::inputTypeToString_abi_cxx11_
              (&local_260,(DrawTestSpec *)(ulong)(&local_1d8)[(long)(int)desc.field_2._12_4_ * 3],
               (InputType)uVar8);
    de::toString<int>(&local_280,(int *)(iopairs + (int)desc.field_2._12_4_));
    std::operator+(&local_240,&local_260,&local_280);
    std::operator+(&local_220,&local_240," to ");
    deqp::gls::DrawTestSpec::outputTypeToString_abi_cxx11_
              (&local_2a0,
               (DrawTestSpec *)
               (ulong)(uint)iopairs[(long)(int)desc.field_2._12_4_ + -1].componentCount,type);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                   &local_220,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
    IVar2 = (&local_1d8)[(long)(int)desc.field_2._12_4_ * 3];
    piVar1 = &spec_3.baseVertex;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    pvVar7->inputType = IVar2;
    OVar3 = iopairs[(long)(int)desc.field_2._12_4_ + -1].componentCount;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    pvVar7->outputType = OVar3;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    pvVar7->storage = STORAGE_BUFFER;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    pvVar7->usage = USAGE_STATIC_DRAW;
    IVar2 = iopairs[(int)desc.field_2._12_4_].input;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    pvVar7->componentCount = IVar2;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    pvVar7->offset = 0;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    pvVar7->stride = 0;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    pvVar7->normalize = false;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    pvVar7->instanceDivisor = 0;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    this_00 = spec_3.attribs.
              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar7->useDefaultAttribute = true;
    description = (char *)std::__cxx11::string::c_str();
    deqp::gls::DrawTest::addIteration((DrawTest *)this_00,(DrawTestSpec *)local_198,description);
    std::__cxx11::string::~string((string *)local_200);
    uVar8 = extraout_RDX_00;
  }
  tcu::TestNode::addChild
            ((TestNode *)this,
             (TestNode *)
             spec_3.attribs.
             super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  deqp::gls::DrawTestSpec::~DrawTestSpec((DrawTestSpec *)local_198);
  return extraout_EAX;
}

Assistant:

void AttributeGroup::init (void)
{
	// Single attribute
	{
		gls::DrawTest*		test				= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), "single_attribute", "Single attribute array.");
		gls::DrawTestSpec	spec;

		spec.apiType							= glu::ApiType::es(3,1);
		spec.primitive							= m_primitive;
		spec.primitiveCount						= 5;
		spec.drawMethod							= m_method;
		spec.indexType							= m_indexType;
		spec.indexPointerOffset					= 0;
		spec.indexStorage						= m_indexStorage;
		spec.first								= 0;
		spec.indexMin							= 0;
		spec.indexMax							= 0;
		spec.instanceCount						= 1;
		spec.indirectOffset						= 0;

		spec.attribs.resize(1);

		spec.attribs[0].inputType				= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[0].outputType				= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[0].storage					= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[0].usage					= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[0].componentCount			= 2;
		spec.attribs[0].offset					= 0;
		spec.attribs[0].stride					= 0;
		spec.attribs[0].normalize				= false;
		spec.attribs[0].instanceDivisor			= 0;
		spec.attribs[0].useDefaultAttribute		= false;

		addTestIterations(test, spec, TYPE_DRAW_COUNT);

		this->addChild(test);
	}

	// Multiple attribute
	{
		gls::DrawTest*		test				= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), "multiple_attributes", "Multiple attribute arrays.");
		gls::DrawTestSpec	spec;

		spec.apiType							= glu::ApiType::es(3,1);
		spec.primitive							= m_primitive;
		spec.primitiveCount						= 5;
		spec.drawMethod							= m_method;
		spec.indexType							= m_indexType;
		spec.indexPointerOffset					= 0;
		spec.indexStorage						= m_indexStorage;
		spec.first								= 0;
		spec.indexMin							= 0;
		spec.indexMax							= 0;
		spec.instanceCount						= 1;
		spec.indirectOffset						= 0;

		spec.attribs.resize(2);

		spec.attribs[0].inputType				= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[0].outputType				= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[0].storage					= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[0].usage					= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[0].componentCount			= 4;
		spec.attribs[0].offset					= 0;
		spec.attribs[0].stride					= 0;
		spec.attribs[0].normalize				= false;
		spec.attribs[0].instanceDivisor			= 0;
		spec.attribs[0].useDefaultAttribute		= false;

		spec.attribs[1].inputType				= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[1].outputType				= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[1].storage					= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[1].usage					= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[1].componentCount			= 2;
		spec.attribs[1].offset					= 0;
		spec.attribs[1].stride					= 0;
		spec.attribs[1].normalize				= false;
		spec.attribs[1].instanceDivisor			= 0;
		spec.attribs[1].useDefaultAttribute		= false;

		addTestIterations(test, spec, TYPE_DRAW_COUNT);

		this->addChild(test);
	}

	// Multiple attribute, second one divided
	{
		gls::DrawTest*		test					= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), "instanced_attributes", "Instanced attribute array.");
		gls::DrawTestSpec	spec;

		spec.apiType								= glu::ApiType::es(3,1);
		spec.primitive								= m_primitive;
		spec.primitiveCount							= 5;
		spec.drawMethod								= m_method;
		spec.indexType								= m_indexType;
		spec.indexPointerOffset						= 0;
		spec.indexStorage							= m_indexStorage;
		spec.first									= 0;
		spec.indexMin								= 0;
		spec.indexMax								= 0;
		spec.instanceCount							= 1;
		spec.indirectOffset							= 0;

		spec.attribs.resize(3);

		spec.attribs[0].inputType					= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[0].outputType					= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[0].storage						= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[0].usage						= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[0].componentCount				= 4;
		spec.attribs[0].offset						= 0;
		spec.attribs[0].stride						= 0;
		spec.attribs[0].normalize					= false;
		spec.attribs[0].instanceDivisor				= 0;
		spec.attribs[0].useDefaultAttribute			= false;

		// Add another position component so the instances wont be drawn on each other
		spec.attribs[1].inputType					= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[1].outputType					= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[1].storage						= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[1].usage						= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[1].componentCount				= 2;
		spec.attribs[1].offset						= 0;
		spec.attribs[1].stride						= 0;
		spec.attribs[1].normalize					= false;
		spec.attribs[1].instanceDivisor				= 1;
		spec.attribs[1].useDefaultAttribute			= false;
		spec.attribs[1].additionalPositionAttribute	= true;

		// Instanced color
		spec.attribs[2].inputType					= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[2].outputType					= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[2].storage						= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[2].usage						= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[2].componentCount				= 3;
		spec.attribs[2].offset						= 0;
		spec.attribs[2].stride						= 0;
		spec.attribs[2].normalize					= false;
		spec.attribs[2].instanceDivisor				= 1;
		spec.attribs[2].useDefaultAttribute			= false;

		addTestIterations(test, spec, TYPE_INSTANCE_COUNT);

		this->addChild(test);
	}

	// Multiple attribute, second one default
	{
		gls::DrawTest*		test				= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), "default_attribute", "Attribute specified with glVertexAttrib*.");
		gls::DrawTestSpec	spec;

		spec.apiType							= glu::ApiType::es(3,1);
		spec.primitive							= m_primitive;
		spec.primitiveCount						= 5;
		spec.drawMethod							= m_method;
		spec.indexType							= m_indexType;
		spec.indexPointerOffset					= 0;
		spec.indexStorage						= m_indexStorage;
		spec.first								= 0;
		spec.indexMin							= 0;
		spec.indexMax							= 0;
		spec.instanceCount						= 1;
		spec.indirectOffset						= 0;

		spec.attribs.resize(2);

		spec.attribs[0].inputType				= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[0].outputType				= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[0].storage					= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[0].usage					= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[0].componentCount			= 2;
		spec.attribs[0].offset					= 0;
		spec.attribs[0].stride					= 0;
		spec.attribs[0].normalize				= false;
		spec.attribs[0].instanceDivisor			= 0;
		spec.attribs[0].useDefaultAttribute		= false;

		struct IOPair
		{
			gls::DrawTestSpec::InputType  input;
			gls::DrawTestSpec::OutputType output;
			int							  componentCount;
		} iopairs[] =
		{
			{ gls::DrawTestSpec::INPUTTYPE_FLOAT,        gls::DrawTestSpec::OUTPUTTYPE_VEC2,  4 },
			{ gls::DrawTestSpec::INPUTTYPE_FLOAT,        gls::DrawTestSpec::OUTPUTTYPE_VEC4,  2 },
			{ gls::DrawTestSpec::INPUTTYPE_INT,          gls::DrawTestSpec::OUTPUTTYPE_IVEC3, 4 },
			{ gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT, gls::DrawTestSpec::OUTPUTTYPE_UVEC2, 4 },
		};

		for (int ioNdx = 0; ioNdx < DE_LENGTH_OF_ARRAY(iopairs); ++ioNdx)
		{
			const std::string desc = gls::DrawTestSpec::inputTypeToString(iopairs[ioNdx].input) + de::toString(iopairs[ioNdx].componentCount) + " to " + gls::DrawTestSpec::outputTypeToString(iopairs[ioNdx].output);

			spec.attribs[1].inputType			= iopairs[ioNdx].input;
			spec.attribs[1].outputType			= iopairs[ioNdx].output;
			spec.attribs[1].storage				= gls::DrawTestSpec::STORAGE_BUFFER;
			spec.attribs[1].usage				= gls::DrawTestSpec::USAGE_STATIC_DRAW;
			spec.attribs[1].componentCount		= iopairs[ioNdx].componentCount;
			spec.attribs[1].offset				= 0;
			spec.attribs[1].stride				= 0;
			spec.attribs[1].normalize			= false;
			spec.attribs[1].instanceDivisor		= 0;
			spec.attribs[1].useDefaultAttribute	= true;

			test->addIteration(spec, desc.c_str());
		}

		this->addChild(test);
	}
}